

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinkedObjectFile.cpp
# Opt level: O2

void __thiscall LinkedObjectFile::disassemble_functions(LinkedObjectFile *this)

{
  uint32_t *puVar1;
  pointer pFVar2;
  bool bVar3;
  reference pvVar4;
  reference this_00;
  reference word;
  size_type __n;
  size_type __n_00;
  pointer pFVar5;
  Instruction local_100;
  
  for (__n_00 = 0; (long)__n_00 < (long)this->segments; __n_00 = __n_00 + 1) {
    pvVar4 = std::
             vector<std::vector<Function,_std::allocator<Function>_>,_std::allocator<std::vector<Function,_std::allocator<Function>_>_>_>
             ::at(&this->functions_by_seg,__n_00);
    pFVar2 = (pvVar4->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (pFVar5 = (pvVar4->super__Vector_base<Function,_std::allocator<Function>_>)._M_impl.
                  super__Vector_impl_data._M_start; pFVar5 != pFVar2; pFVar5 = pFVar5 + 1) {
      for (__n = (size_type)pFVar5->start_word; (long)__n < (long)pFVar5->end_word; __n = __n + 1) {
        this_00 = std::
                  vector<std::vector<LinkedWord,_std::allocator<LinkedWord>_>,_std::allocator<std::vector<LinkedWord,_std::allocator<LinkedWord>_>_>_>
                  ::at(&this->words_by_seg,__n_00);
        word = std::vector<LinkedWord,_std::allocator<LinkedWord>_>::at(this_00,__n);
        decode_instruction(&local_100,word,this,(int)__n_00,(int)__n);
        std::vector<Instruction,_std::allocator<Instruction>_>::emplace_back<Instruction>
                  (&pFVar5->instructions,&local_100);
        Instruction::~Instruction(&local_100);
        bVar3 = Instruction::is_valid
                          ((pFVar5->instructions).
                           super__Vector_base<Instruction,_std::allocator<Instruction>_>._M_impl.
                           super__Vector_impl_data._M_finish + -1);
        if (bVar3) {
          puVar1 = &(this->stats).decoded_ops;
          *puVar1 = *puVar1 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void LinkedObjectFile::disassemble_functions() {
  for (int seg = 0; seg < segments; seg++) {
    for (auto& function : functions_by_seg.at(seg)) {
      for (auto word = function.start_word; word < function.end_word; word++) {
        // decode!
        function.instructions.push_back(
            decode_instruction(words_by_seg.at(seg).at(word), *this, seg, word));
        if (function.instructions.back().is_valid()) {
          stats.decoded_ops++;
        }
      }
    }
  }
}